

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

storage_t Test<unsigned_int,_unsigned_int,_double>::median
                    (vector<double,_std::allocator<double>_> *values)

{
  storage_t sVar1;
  long lVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> sortvalues;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_20,values);
  lVar3 = (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((lVar3 != 0) &&
     ((pointer)((lVar3 >> 1 & 0xfffffffffffffff8U) +
               (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) !=
      local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    lVar2 = 0x3f;
    if (lVar3 >> 3 != 0) {
      for (; (ulong)(lVar3 >> 3) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  sVar1 = *(storage_t *)
           ((long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
           ((long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U));
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return sVar1;
}

Assistant:

static storage_t median(const std::vector<storage_t>& values)
    {
        std::vector<storage_t> sortvalues = values;
        std::nth_element(sortvalues.begin(), sortvalues.begin() + sortvalues.size() / 2, sortvalues.end());
        auto medianIt = sortvalues.cbegin() + sortvalues.size() / 2;
        return *medianIt;
    }